

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  long lVar4;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar2->m_testCtx,"sampler_type","Sampler type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)0x0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021aba98;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"sampler_type_multisample_array",
             "MSAA array sampler type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)"GL_OES_texture_storage_multisample_2d_array";
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abba8;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"sampler_type_texture_buffer",
             "Texture buffer sampler type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)"GL_EXT_texture_buffer";
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abc58;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"image_type_texture_buffer",
             "Texture buffer image type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)"GL_EXT_texture_buffer";
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abd08;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"sampler_type_cube_array",
             "Cube array sampler type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)"GL_EXT_texture_cube_map_array";
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abdb8;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"image_type_cube_array",
             "Cube array image type cases");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3[1].m_testCtx = (TestContext *)"GL_EXT_texture_cube_map_array";
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abe80;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar4 = 8;
  do {
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&init::shaderTypes[0].caseName + lVar4);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar3,pCVar2->m_testCtx,*(char **)(&UNK_021aba08 + lVar4),
               glcts::fixed_sample_locations_values + 1);
    pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021abf28;
    *(undefined4 *)&pTVar3[1].m_testCtx = uVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x68);
  return extraout_EAX;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	addChild(new CoreSamplerTypeCase			(m_context, "sampler_type",						"Sampler type cases"));
	addChild(new MSArraySamplerTypeCase			(m_context, "sampler_type_multisample_array",	"MSAA array sampler type cases"));
	addChild(new TextureBufferSamplerTypeCase	(m_context, "sampler_type_texture_buffer",		"Texture buffer sampler type cases"));
	addChild(new TextureBufferImageTypeCase		(m_context, "image_type_texture_buffer",		"Texture buffer image type cases"));
	addChild(new CubeArraySamplerTypeCase		(m_context, "sampler_type_cube_array",			"Cube array sampler type cases"));
	addChild(new CubeArrayImageTypeCase			(m_context, "image_type_cube_array",			"Cube array image type cases"));

	// shader info log tests
	// \note, there exists similar tests in gles3 module. However, the gles31 could use a different
	//        shader compiler with different INFO_LOG bugs.
	{
		static const struct
		{
			const char*		caseName;
			glu::ShaderType	caseType;
		} shaderTypes[] =
		{
			{ "info_log_vertex",		glu::SHADERTYPE_VERTEX					},
			{ "info_log_fragment",		glu::SHADERTYPE_FRAGMENT				},
			{ "info_log_geometry",		glu::SHADERTYPE_GEOMETRY				},
			{ "info_log_tess_ctrl",		glu::SHADERTYPE_TESSELLATION_CONTROL	},
			{ "info_log_tess_eval",		glu::SHADERTYPE_TESSELLATION_EVALUATION	},
			{ "info_log_compute",		glu::SHADERTYPE_COMPUTE					},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
			addChild(new ShaderLogCase(m_context, shaderTypes[ndx].caseName, "", shaderTypes[ndx].caseType));
	}
}